

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValuesConstraint.h
# Opt level: O0

void __thiscall
TCLAP::
ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ValuesConstraint(ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *allowed)

{
  size_type sVar1;
  reference pvVar2;
  string local_1c8 [8];
  string temp;
  ostringstream local_1a8 [8];
  ostringstream os;
  uint local_2c;
  allocator local_25;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *allowed_local;
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = allowed;
  allowed_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Constraint(&this->
              super_Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->
  super_Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Constraint = (_func_int **)&PTR_description_0013b9d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_allowed,local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_typeDesc,"",&local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_25);
  local_2c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_allowed);
    if (sVar1 <= local_2c) break;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->_allowed,(ulong)local_2c);
    std::operator<<((ostream *)local_1a8,(string *)pvVar2);
    std::__cxx11::ostringstream::str();
    if (local_2c != 0) {
      std::__cxx11::string::operator+=((string *)&this->_typeDesc,"|");
    }
    std::__cxx11::string::operator+=((string *)&this->_typeDesc,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

ValuesConstraint<T>::ValuesConstraint(std::vector<T>& allowed)
: _allowed(allowed),
  _typeDesc("")
{ 
    for ( unsigned int i = 0; i < _allowed.size(); i++ )
    {
        std::ostringstream os;
        os << _allowed[i];

        std::string temp( os.str() ); 

        if ( i > 0 )
			_typeDesc += "|";
        _typeDesc += temp;
    }
}